

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.h
# Opt level: O2

string * __thiscall
cppwinrt::get_field_abi_abi_cxx11_
          (string *__return_storage_ptr__,cppwinrt *this,writer *w,Field *field)

{
  undefined8 uVar1;
  bool bVar2;
  uint uVar3;
  variant_alternative_t<1UL,_variant<ElementType,_coded_index<TypeDefOrRef>,_GenericTypeIndex,_GenericTypeInstSig,_GenericMethodTypeIndex>_>
  *pvVar4;
  Field *field_00;
  TypeDef TVar5;
  Field __begin2;
  coded_index<winmd::reader::TypeDefOrRef> ref;
  FieldSig signature;
  undefined1 local_188 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  table_base *local_138;
  uint local_130;
  undefined1 local_128 [16];
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  FieldSig local_d8;
  
  winmd::reader::Field::Signature(&local_d8,(Field *)w);
  local_148._M_allocated_capacity = 1;
  local_148._8_8_ = (long)"-% %" + 3;
  local_188._24_8_ = this;
  writer_base<cppwinrt::writer>::write_temp<winmd::reader::TypeSig>
            (__return_storage_ptr__,(writer_base<cppwinrt::writer> *)this,(string_view *)&local_148,
             &local_d8.m_type);
  local_148._8_8_ = (__return_storage_ptr__->_M_dataplus)._M_p;
  local_148._M_allocated_capacity = __return_storage_ptr__->_M_string_length;
  local_168._M_string_length = (size_type)"struct ";
  local_168._M_dataplus._M_p = (pointer)0x7;
  bVar2 = starts_with((string_view *)&local_148,(string_view *)&local_168);
  if (bVar2) {
    pvVar4 = std::
             get<1ul,winmd::reader::ElementType,winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,winmd::reader::GenericTypeIndex,winmd::reader::GenericTypeInstSig,winmd::reader::GenericMethodTypeIndex>
                       (&local_d8.m_type.m_type);
    local_128._0_8_ =
         (pvVar4->super_typed_index<winmd::reader::TypeDefOrRef>).
         super_index_base<winmd::reader::TypeDefOrRef>.m_table;
    local_128._8_8_ =
         *(undefined8 *)
          &(pvVar4->super_typed_index<winmd::reader::TypeDefOrRef>).
           super_index_base<winmd::reader::TypeDefOrRef>.m_value;
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
    TVar5 = winmd::reader::find_required((coded_index<winmd::reader::TypeDefOrRef> *)local_128);
    local_168._0_12_ = TVar5.super_row_base<winmd::reader::TypeDef>._0_12_;
    winmd::reader::TypeDef::FieldList
              ((pair<winmd::reader::Field,_winmd::reader::Field> *)&local_148,(TypeDef *)&local_168)
    ;
    local_188._0_8_ = local_148._M_allocated_capacity;
    local_188._8_8_ = local_148._8_8_;
    uVar1 = local_188._8_8_;
    field_00 = (Field *)(ulong)local_130;
    local_188._8_4_ = (undefined4)local_148._8_8_;
    uVar3 = local_188._8_4_;
    local_188._8_8_ = uVar1;
    while (((table_base *)local_188._0_8_ != local_138 || (uVar3 != local_130))) {
      get_field_abi_abi_cxx11_(&local_118,(cppwinrt *)local_188._24_8_,(writer *)local_188,field_00)
      ;
      std::operator+(&local_f8," ",&local_118);
      std::operator+(&local_168,&local_f8," ");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_168);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_118);
      local_168._0_16_ = winmd::reader::Field::Name((Field *)local_188);
      std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                ((string *)__return_storage_ptr__,
                 (basic_string_view<char,_std::char_traits<char>_> *)&local_168);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      uVar3 = local_188._8_4_ + 1;
      local_188._8_4_ = uVar3;
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  winmd::reader::FieldSig::~FieldSig(&local_d8);
  return __return_storage_ptr__;
}

Assistant:

static std::string get_field_abi(writer& w, Field const& field)
    {
        auto signature = field.Signature();
        auto const& type = signature.Type();
        std::string name = w.write_temp("%", type);

        if (starts_with(name, "struct "))
        {
            auto ref = std::get<coded_index<TypeDefOrRef>>(type.Type());

            name = "struct{";

            for (auto&& nested : find_required(ref).FieldList())
            {
                name += " " + get_field_abi(w, nested) + " ";
                name += nested.Name();
                name += ";";
            }

            name += " }";
        }

        return name;
    }